

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

float memory_tree_ns::train_node(memory_tree *b,single_learner *base,example *ec,uint32_t cn)

{
  polylabel *ppVar1;
  polyprediction *ppVar2;
  float fVar3;
  float fVar4;
  node *pnVar5;
  double dVar6;
  labels preds;
  labels multilabels;
  float local_8c;
  label_t local_88;
  float *local_78;
  float *pfStack_70;
  float *local_68;
  size_t sStack_60;
  label_t local_58;
  wclass *pwStack_50;
  wclass *local_48;
  size_t sStack_40;
  
  ppVar1 = &ec->l;
  ppVar2 = &ec->pred;
  if (b->oas == 0) {
    local_88 = ppVar1->multi;
    local_8c = ppVar2->scalar;
  }
  else {
    local_58 = ppVar1->multi;
    pwStack_50 = (ec->l).cs.costs._end;
    local_48 = (ec->l).cs.costs.end_array;
    sStack_40 = (ec->l).cs.costs.erase_count;
    local_78 = (ppVar2->scalars)._begin;
    pfStack_70 = (ec->pred).scalars._end;
    local_68 = (ec->pred).scalars.end_array;
    sStack_60 = (ec->pred).scalars.erase_count;
    local_8c = 0.0;
  }
  (ec->l).cs.costs._begin = (wclass *)0x3f8000003f800000;
  (ec->l).simple.initial = 0.0;
  LEARNER::learner<char,_example>::predict(base,ec,(ulong)(b->nodes)._begin[cn].base_router);
  fVar3 = (ec->pred).scalar;
  fVar4 = b->alpha;
  pnVar5 = (b->nodes)._begin;
  dVar6 = log(pnVar5[cn].nl / (pnVar5[cn].nr + 0.1));
  fVar3 = *(float *)(&DAT_00241270 +
                    (ulong)((float)((double)(fVar3 * b->alpha) +
                                   (dVar6 * (1.0 - (double)fVar4)) / 0.6931471805599453) < 0.0) * 4)
  ;
  fVar4 = ec->weight;
  ec->weight = 1.0;
  (ec->l).simple.label = fVar3;
  *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0x3f800000;
  LEARNER::learner<char,_example>::learn(base,ec,(ulong)(b->nodes)._begin[cn].base_router);
  LEARNER::learner<char,_example>::predict(base,ec,(ulong)(b->nodes)._begin[cn].base_router);
  fVar3 = (ec->pred).scalar;
  if (b->oas == 0) {
    ppVar1->multi = local_88;
    ppVar2->scalar = local_8c;
  }
  else {
    (ec->pred).scalars.end_array = local_68;
    (ec->pred).scalars.erase_count = sStack_60;
    (ppVar2->scalars)._begin = local_78;
    (ec->pred).scalars._end = pfStack_70;
    (ec->l).cs.costs.end_array = local_48;
    (ec->l).cs.costs.erase_count = sStack_40;
    ppVar1->multi = local_58;
    (ec->l).cs.costs._end = pwStack_50;
  }
  ec->weight = fVar4;
  return fVar3;
}

Assistant:

float train_node(memory_tree& b, single_learner& base, example& ec, const uint32_t cn)
    {
        //predict, learn and predict
        //note: here we first train the router and then predict.
        MULTICLASS::label_t mc;
        uint32_t save_multi_pred = 0;
        MULTILABEL::labels multilabels;
        MULTILABEL::labels preds;
        if (b.oas == false){
            mc = ec.l.multi;
            save_multi_pred = ec.pred.multiclass;
        }
        else{
            multilabels = ec.l.multilabels;
            preds = ec.pred.multilabels;
        }

        ec.l.simple = {1.f, 1.f, 0.};
        base.predict(ec, b.nodes[cn].base_router);
        float prediction = ec.pred.scalar; 
	    //float imp_weight = 1.f; //no importance weight.
        
        float weighted_value = (1.-b.alpha)*log(b.nodes[cn].nl/(b.nodes[cn].nr+1e-1))/log(2.)+b.alpha*prediction;
        float route_label = weighted_value < 0.f ? -1.f : 1.f;
        
        //ec.l.simple = {route_label, imp_weight, 0.f}; 
        float ec_input_weight = ec.weight;
        ec.weight = 1.f;
	    ec.l.simple = {route_label, 1., 0.f};
        base.learn(ec, b.nodes[cn].base_router); //update the router according to the new example.
        
        base.predict(ec, b.nodes[cn].base_router);
        float save_binary_scalar = ec.pred.scalar;

        if(b.oas == false){
            ec.l.multi = mc;
            ec.pred.multiclass = save_multi_pred;
        }
        else{
            ec.pred.multilabels = preds;
            ec.l.multilabels = multilabels;
        }
        ec.weight = ec_input_weight;

        return save_binary_scalar;
    }